

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O1

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::toCCDF(Distributions *this,vector<double,_std::allocator<double>_> *distribution)

{
  pointer pdVar1;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> *this_00;
  uint uVar3;
  long lVar4;
  ulong uVar6;
  ulong uVar7;
  pointer *__ptr;
  allocator_type local_21;
  value_type_conflict4 local_20;
  ulong uVar5;
  
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3,&local_20,&local_21);
  *(vector<double,_std::allocator<double>_> **)this = this_00;
  pdVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
    if (uVar7 <= lVar4 - 1U) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    pdVar2[lVar4 + -1] = pdVar1[lVar4 + -1];
    if (-1 < (int)lVar4 + -2) {
      uVar3 = (int)lVar4 - 1;
      do {
        uVar5 = (ulong)uVar3;
        uVar6 = uVar5;
        if ((uVar7 <= uVar5) || (uVar6 = (ulong)(uVar3 - 1), uVar7 <= uVar6)) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
        }
        pdVar2[uVar6] = pdVar1[uVar6] + pdVar2[uVar5];
        uVar3 = uVar3 - 1;
      } while (0 < (int)uVar3);
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(distribution.size()-1) = distribution[distribution.size()-1];
	for (int i=distribution.size()-2; i>=0; --i) {
		result->at(i) = distribution[i] + result->at(i+1);
	}
	return result;
}